

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::FlushExprTreeVector
          (WatWriter *this,
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          *expr_trees)

{
  ExprType EVar1;
  IfExceptExpr *expr;
  WatWriter *pWVar2;
  char *pcVar3;
  TryExpr *try_expr;
  long lVar4;
  ExprVisitor local_b8;
  Delegate local_68;
  ExprVisitorDelegate delegate;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  local_48;
  
  pWVar2 = (WatWriter *)
           (expr_trees->
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           )._M_impl.super__Vector_impl_data._M_start;
  delegate.writer_ =
       (WatWriter *)
       (expr_trees->
       super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (pWVar2 != delegate.writer_) {
    do {
      expr = (IfExceptExpr *)pWVar2->options_;
      lVar4 = (long)pWVar2->current_func_ -
              (long)(((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                       *)&pWVar2->module_)->
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      local_48.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start =
           std::
           _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           ::_M_allocate((_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                          *)(lVar4 >> 5),(size_t)expr_trees);
      local_48.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(lVar4 + (long)local_48.
                                   super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
      local_48.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           std::__uninitialized_copy<false>::
           __uninit_copy<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>,wabt::(anonymous_namespace)::ExprTree*>
                     ((((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                         *)&pWVar2->module_)->
                      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      )._M_impl.super__Vector_impl_data._M_start,(ExprTree *)pWVar2->current_func_,
                      local_48.
                      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      EVar1 = (expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.type_;
      if ((int)EVar1 < 0x14) {
        if (EVar1 == Block) {
          WritePuts(this,"(",None);
          if ((expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.type_ == Block) {
            Opcode::GetInfo((Info *)&local_b8,(Opcode *)&Opcode::Block_Opcode);
            WriteBeginBlock(this,Block,&expr->true_,(char *)local_b8.delegate_);
            if ((expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.type_ == Block) {
LAB_00f687d6:
              WriteFoldedExprList(this,&(expr->true_).exprs);
              FlushExprTreeStack(this);
              goto LAB_00f68875;
            }
          }
          pcVar3 = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
          ;
LAB_00f688d7:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/cast.h"
                        ,0x48,pcVar3);
        }
        if (EVar1 == If) {
          WritePuts(this,"(",None);
          Opcode::GetInfo((Info *)&local_b8,(Opcode *)&Opcode::If_Opcode);
          WriteBeginBlock(this,If,&expr->true_,(char *)local_b8.delegate_);
          FlushExprTreeVector(this,&local_48);
          WritePuts(this,"(",None);
          WritePuts(this,"then",Newline);
          this->indent_ = this->indent_ + 2;
          WriteFoldedExprList(this,&(expr->true_).exprs);
          FlushExprTreeStack(this);
          WriteClose(this,Newline);
          goto LAB_00f686c6;
        }
LAB_00f687f5:
        WritePuts(this,"(",None);
        local_68._vptr_Delegate = (_func_int **)&PTR__Delegate_01547600;
        delegate.super_Delegate._vptr_Delegate = (_func_int **)this;
        ExprVisitor::ExprVisitor(&local_b8,&local_68);
        ExprVisitor::VisitExpr(&local_b8,(Expr *)expr);
        if (local_b8.expr_iter_stack_.
            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_b8.state_stack_.
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        this->indent_ = this->indent_ + 2;
        FlushExprTreeVector(this,&local_48);
      }
      else {
        if (EVar1 == IfExcept) {
          WritePuts(this,"(",None);
          WriteBeginIfExceptBlock(this,expr);
          FlushExprTreeVector(this,&local_48);
          WritePuts(this,"(",None);
          WritePuts(this,"then",Newline);
          this->indent_ = this->indent_ + 2;
          WriteFoldedExprList(this,&(expr->true_).exprs);
          FlushExprTreeStack(this);
          WriteClose(this,Newline);
LAB_00f686c6:
          if ((expr->false_).size_ == 0) goto LAB_00f68875;
          WritePuts(this,"(",None);
          pcVar3 = "else";
        }
        else {
          if (EVar1 == Loop) {
            WritePuts(this,"(",None);
            if ((expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.type_ == Loop) {
              Opcode::GetInfo((Info *)&local_b8,(Opcode *)&Opcode::Loop_Opcode);
              WriteBeginBlock(this,Loop,&expr->true_,(char *)local_b8.delegate_);
              if ((expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.type_ == Loop)
              goto LAB_00f687d6;
            }
            pcVar3 = 
            "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
            ;
            goto LAB_00f688d7;
          }
          if (EVar1 != Try) goto LAB_00f687f5;
          WritePuts(this,"(",None);
          Opcode::GetInfo((Info *)&local_b8,(Opcode *)&Opcode::Try_Opcode);
          WriteBeginBlock(this,Try,&expr->true_,(char *)local_b8.delegate_);
          FlushExprTreeVector(this,&local_48);
          WriteFoldedExprList(this,&(expr->true_).exprs);
          FlushExprTreeStack(this);
          WritePuts(this,"(",None);
          pcVar3 = "catch";
        }
        WritePuts(this,pcVar3,Newline);
        this->indent_ = this->indent_ + 2;
        WriteFoldedExprList(this,&expr->false_);
        FlushExprTreeStack(this);
        WriteClose(this,Newline);
      }
LAB_00f68875:
      expr_trees = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    *)&DAT_00000002;
      WriteClose(this,Newline);
      std::
      vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ::~vector(&local_48);
      pWVar2 = (WatWriter *)&pWVar2->result_;
    } while (pWVar2 != delegate.writer_);
  }
  return;
}

Assistant:

void WatWriter::FlushExprTreeVector(const std::vector<ExprTree>& expr_trees) {
  WABT_TRACE_ARGS(FlushExprTreeVector, "%zu", expr_trees.size());
  for (auto expr_tree : expr_trees) {
    FlushExprTree(expr_tree);
  }
}